

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FTSSEL(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      tcg_gen_gvec_3_ool_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,
                 s->sve_len,s->sve_len,0,(gen_helper_gvec_3_conflict1 *)trans_FTSSEL::fns[a->esz]);
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FTSSEL(DisasContext *s, arg_rrr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        NULL,
        gen_helper_sve_ftssel_h,
        gen_helper_sve_ftssel_s,
        gen_helper_sve_ftssel_d,
    };
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           vsz, vsz, 0, fns[a->esz]);
    }
    return true;
}